

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,int field_index,int field_count,Reflection *reflection,
          FieldDescriptor *field,TextGenerator *generator)

{
  FastFieldValuePrinter *pFVar1;
  AlphaNum *a;
  string local_78;
  AlphaNum local_58;
  
  if (this->use_field_number_ == true) {
    strings::AlphaNum::AlphaNum(&local_58,*(int *)(field + 0x44));
    StrCat_abi_cxx11_(&local_78,(protobuf *)&local_58,a);
    (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
              (generator,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__cxx11::string::~string((string *)&local_78);
    return;
  }
  pFVar1 = GetFieldPrinter(this,field);
  (*pFVar1->_vptr_FastFieldValuePrinter[0xc])
            (pFVar1,message,(ulong)(uint)field_index,(ulong)(uint)field_count,reflection,field);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         int field_index, int field_count,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator* generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator->PrintString(StrCat(field->number()));
    return;
  }

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  printer->PrintFieldName(message, field_index, field_count, reflection, field,
                          generator);
}